

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::AddRawTransactionRequest::ConvertFromStruct
          (AddRawTransactionRequest *this,AddRawTransactionRequestStruct *data)

{
  AddRawTransactionRequestStruct *data_local;
  AddRawTransactionRequest *this_local;
  
  std::__cxx11::string::operator=((string *)&this->tx_,(string *)data);
  core::JsonObjectVector<cfd::js::api::json::TxInRequest,_cfd::js::api::TxInRequestStruct>::
  ConvertFromStruct(&this->txins_,&data->txins);
  core::JsonObjectVector<cfd::js::api::json::TxOutRequest,_cfd::js::api::TxOutRequestStruct>::
  ConvertFromStruct(&this->txouts_,&data->txouts);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void AddRawTransactionRequest::ConvertFromStruct(
    const AddRawTransactionRequestStruct& data) {
  tx_ = data.tx;
  txins_.ConvertFromStruct(data.txins);
  txouts_.ConvertFromStruct(data.txouts);
  ignore_items = data.ignore_items;
}